

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  ulong uVar3;
  xpath_node *pxVar4;
  xpath_node *last;
  xpath_node *pxVar5;
  size_t i;
  size_t sVar6;
  xpath_node *pxVar7;
  size_t size;
  size_t sVar8;
  xpath_node *it;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  xpath_context c;
  xpath_node cn;
  
  pxVar4 = ns->_end;
  sVar8 = ((long)pxVar4 - (long)ns->_begin >> 4) - first;
  if (sVar8 != 0) {
    this_00 = this->_right;
    pxVar5 = ns->_begin + first;
    if ((this->_test & 0xfeU) == 2) {
      xpath_node::xpath_node(&cn);
      c.n._node = cn._node;
      c.n._attribute = cn._attribute;
      c.position = 1;
      c.size = sVar8;
      dVar9 = eval_number(this_00,&c,stack);
      if ((1.0 <= dVar9) &&
         (auVar10._8_4_ = (int)(sVar8 >> 0x20), auVar10._0_8_ = sVar8, auVar10._12_4_ = 0x45300000,
         dVar9 <= (auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0))) {
        uVar3 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
        auVar11._8_4_ = (int)(uVar3 >> 0x20);
        auVar11._0_8_ = uVar3;
        auVar11._12_4_ = 0x45300000;
        dVar13 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        if ((dVar9 == dVar13) && (!NAN(dVar9) && !NAN(dVar13))) {
          pxVar1 = pxVar5[uVar3 - 1]._attribute._attr;
          (pxVar5->_node)._root = pxVar5[uVar3 - 1]._node._root;
          (pxVar5->_attribute)._attr = pxVar1;
          pxVar5 = pxVar5 + 1;
        }
      }
    }
    else if (this_00->_rettype == '\x02') {
      sVar6 = 1;
      for (pxVar7 = pxVar5; pxVar7 != pxVar4; pxVar7 = pxVar7 + 1) {
        c.n._node._root = (pxVar7->_node)._root;
        c.n._attribute._attr = (pxVar7->_attribute)._attr;
        c.position = sVar6;
        c.size = sVar8;
        dVar9 = eval_number(this_00,&c,stack);
        auVar12._8_4_ = (int)(sVar6 >> 0x20);
        auVar12._0_8_ = sVar6;
        auVar12._12_4_ = 0x45300000;
        dVar13 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
        if ((dVar9 == dVar13) && (!NAN(dVar9) && !NAN(dVar13))) {
          pxVar1 = (pxVar7->_attribute)._attr;
          (pxVar5->_node)._root = (pxVar7->_node)._root;
          (pxVar5->_attribute)._attr = pxVar1;
          pxVar5 = pxVar5 + 1;
          if (once) break;
        }
        sVar6 = sVar6 + 1;
        pxVar4 = ns->_end;
      }
    }
    else {
      sVar6 = 1;
      for (pxVar7 = pxVar5; pxVar7 != pxVar4; pxVar7 = pxVar7 + 1) {
        c.n._node._root = (pxVar7->_node)._root;
        c.n._attribute._attr = (pxVar7->_attribute)._attr;
        c.position = sVar6;
        c.size = sVar8;
        bVar2 = eval_boolean(this_00,&c,stack);
        if (bVar2) {
          pxVar1 = (pxVar7->_attribute)._attr;
          (pxVar5->_node)._root = (pxVar7->_node)._root;
          (pxVar5->_attribute)._attr = pxVar1;
          pxVar5 = pxVar5 + 1;
          if (once) break;
        }
        sVar6 = sVar6 + 1;
        pxVar4 = ns->_end;
      }
    }
    ns->_end = pxVar5;
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}